

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O2

void helics::loadOptions<toml::basic_value<toml::type_config>,helics::Input>
               (ValueFederate *fed,basic_value<toml::type_config> *data,Input *objUpdate)

{
  pointer pbVar1;
  undefined1 auVar2 [16];
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *peVar3;
  array_type *paVar4;
  string_type *psVar5;
  enable_if_t<detail::is_exact_toml_type<basic_string<char>,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<basic_string<char,_char_traits<char>,_allocator<char>_>_>_&>
  pbVar6;
  ulong in_R9;
  basic_value<toml::type_config> *target;
  pointer pbVar7;
  basic_value<toml::type_config> *target_1;
  string_view info_00;
  string_view target_00;
  string_view target_01;
  string_view target_02;
  string info;
  value uval;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> targets;
  allocator<char> local_251;
  _Any_data local_250;
  undefined1 local_240 [16];
  string local_230;
  undefined8 local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c8 [16];
  code *local_1b8;
  code *local_1b0;
  undefined1 local_f8 [16];
  code *local_e8;
  code *local_e0;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"flags",&local_251);
  local_230._M_dataplus._M_p = (pointer)objUpdate;
  local_230._M_string_length = (size_type)fed;
  toml::basic_value<toml::type_config>::basic_value((basic_value<toml::type_config> *)local_1c8);
  peVar3 = toml::find_or<toml::type_config,std::__cxx11::string>
                     (data,&local_1e8,(basic_value<toml::type_config> *)local_1c8);
  toml::basic_value<toml::type_config>::basic_value
            ((basic_value<toml::type_config> *)local_f8,peVar3);
  if (local_f8[0] != empty) {
    if (local_f8[0] == array) {
      paVar4 = toml::basic_value<toml::type_config>::as_array
                         ((basic_value<toml::type_config> *)local_f8);
      pbVar1 = (paVar4->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar7 = (paVar4->
                    super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1;
          pbVar7 = pbVar7 + 1) {
        psVar5 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar7);
        loadOptions<toml::basic_value<toml::type_config>,_helics::Input>::anon_class_16_2_5e8ce78e::
        operator()((anon_class_16_2_5e8ce78e *)&local_230,(string *)psVar5);
      }
    }
    else {
      psVar5 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                         ((basic_value<toml::type_config> *)local_f8);
      loadOptions<toml::basic_value<toml::type_config>,_helics::Input>::anon_class_16_2_5e8ce78e::
      operator()((anon_class_16_2_5e8ce78e *)&local_230,(string *)psVar5);
    }
  }
  if (local_1e8._M_dataplus._M_p[local_1e8._M_string_length - 1] == 's') {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8);
    local_250._M_unused._M_object = local_240;
    local_250._8_8_ = 0;
    local_240._0_8_ = local_240._0_8_ & 0xffffffffffffff00;
    pbVar6 = toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                       (data,&local_1e8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_250);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_250,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar6);
    if (local_250._8_8_ != 0) {
      loadOptions<toml::basic_value<toml::type_config>,_helics::Input>::anon_class_16_2_5e8ce78e::
      operator()((anon_class_16_2_5e8ce78e *)&local_230,(string *)&local_250);
    }
    std::__cxx11::string::~string((string *)local_250._M_pod_data);
  }
  toml::basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)local_f8);
  toml::basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  local_1c8._0_8_ = (void *)0x0;
  local_1c8._8_8_ = 0;
  local_1b0 = std::
              _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:226:9)>
              ::_M_invoke;
  local_1b8 = std::
              _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:226:9)>
              ::_M_manager;
  local_f8._0_8_ = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:227:9)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:227:9)>
             ::_M_manager;
  local_250._8_8_ = 0;
  local_240._8_8_ =
       std::
       _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:228:9)>
       ::_M_invoke;
  local_240._0_8_ =
       std::
       _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:228:9)>
       ::_M_manager;
  local_250._M_unused._M_object = objUpdate;
  processOptions(data,(function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)local_1c8,
                 (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)local_f8,(function<void_(int,_int)> *)&local_250);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_250);
  CLI::std::_Function_base::~_Function_base((_Function_base *)local_f8);
  CLI::std::_Function_base::~_Function_base((_Function_base *)local_1c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"alias",(allocator<char> *)local_250._M_pod_data);
  local_e0 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:230:42)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:230:42)>
             ::_M_manager;
  local_f8._0_8_ = objUpdate;
  local_f8._8_8_ = fed;
  fileops::callIfMember
            (data,(string *)local_1c8,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)local_f8);
  CLI::std::_Function_base::~_Function_base((_Function_base *)local_f8);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"tolerance",(allocator<char> *)local_f8);
  local_210 = fileops::getOrDefault(data,(string *)local_1c8,-1.0);
  std::__cxx11::string::~string((string *)local_1c8);
  if (0.0 < (double)local_210) {
    if (objUpdate->delta <= 0.0 && objUpdate->delta != 0.0) {
      objUpdate->changeDetectionEnabled = true;
    }
    objUpdate->delta = (double)local_210;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"info",(allocator<char> *)local_f8);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_R9;
  fileops::getOrDefault
            (&local_230,(fileops *)data,(value *)local_1c8,(string *)0x0,
             (string_view)(auVar2 << 0x40));
  std::__cxx11::string::~string((string *)local_1c8);
  if ((ValueFederate *)local_230._M_string_length != (ValueFederate *)0x0) {
    info_00._M_str = local_230._M_dataplus._M_p;
    info_00._M_len = local_230._M_string_length;
    Interface::setInfo(&objUpdate->super_Interface,info_00);
  }
  local_1c8._8_8_ = 0;
  local_1b0 = std::
              _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:242:20)>
              ::_M_invoke;
  local_1b8 = std::
              _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:242:20)>
              ::_M_manager;
  local_1c8._0_8_ = objUpdate;
  loadTags(data,(function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                 *)local_1c8);
  CLI::std::_Function_base::~_Function_base((_Function_base *)local_1c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"targets",&local_251);
  toml::basic_value<toml::type_config>::basic_value((basic_value<toml::type_config> *)local_1c8);
  peVar3 = toml::find_or<toml::type_config,std::__cxx11::string>
                     (data,&local_208,(basic_value<toml::type_config> *)local_1c8);
  toml::basic_value<toml::type_config>::basic_value
            ((basic_value<toml::type_config> *)local_f8,peVar3);
  if (local_f8[0] != empty) {
    if (local_f8[0] == array) {
      paVar4 = toml::basic_value<toml::type_config>::as_array
                         ((basic_value<toml::type_config> *)local_f8);
      pbVar1 = (paVar4->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar7 = (paVar4->
                    super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1;
          pbVar7 = pbVar7 + 1) {
        psVar5 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar7);
        target_00._M_str = (psVar5->_M_dataplus)._M_p;
        target_00._M_len = psVar5->_M_string_length;
        Input::addPublication(objUpdate,target_00);
      }
    }
    else {
      psVar5 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                         ((basic_value<toml::type_config> *)local_f8);
      target_01._M_str = (psVar5->_M_dataplus)._M_p;
      target_01._M_len = psVar5->_M_string_length;
      Input::addPublication(objUpdate,target_01);
    }
  }
  if (local_208._M_dataplus._M_p[local_208._M_string_length - 1] == 's') {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208);
    local_250._M_unused._M_object = local_240;
    local_250._8_8_ = 0;
    local_240._0_8_ = local_240._0_8_ & 0xffffffffffffff00;
    pbVar6 = toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                       (data,&local_208,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_250);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_250,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar6);
    if (local_250._8_8_ != 0) {
      target_02._M_str = (char *)local_250._M_unused._0_8_;
      target_02._M_len = local_250._8_8_;
      Input::addPublication(objUpdate,target_02);
    }
    std::__cxx11::string::~string((string *)local_250._M_pod_data);
  }
  toml::basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)local_f8);
  toml::basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)local_1c8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_230);
  return;
}

Assistant:

static void loadOptions(ValueFederate* fed, const Inp& data, Obj& objUpdate)
{
    using fileops::getOrDefault;

    addTargets(data, "flags", [&objUpdate, fed](const std::string& target) {
        auto oindex = getOptionIndex((target.front() != '-') ? target : target.substr(1));
        const int val = (target.front() != '-') ? 1 : 0;
        if (oindex == HELICS_INVALID_OPTION_INDEX) {
            fed->logWarningMessage(target + " is not a valid flag");
            return;
        }
        objUpdate.setOption(oindex, val);
    });
    processOptions(
        data,
        [](const std::string& option) { return getOptionIndex(option); },
        [](const std::string& value) { return getOptionValue(value); },
        [&objUpdate](int32_t option, int32_t value) { objUpdate.setOption(option, value); });

    fileops::callIfMember(data, "alias", [&objUpdate, fed](std::string_view val) {
        fed->addAlias(objUpdate, val);
    });

    auto tol = getOrDefault(data, "tolerance", -1.0);
    if (tol > 0.0) {
        objUpdate.setMinimumChange(tol);
    }
    auto info = getOrDefault(data, "info", emptyStr);
    if (!info.empty()) {
        objUpdate.setInfo(info);
    }
    loadTags(data, [&objUpdate](std::string_view tagname, std::string_view tagvalue) {
        objUpdate.setTag(tagname, tagvalue);
    });
    addTargets(data, "targets", [&objUpdate](std::string_view target) {
        objUpdate.addTarget(target);
    });
}